

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

char * readDataOfferAsString(wl_data_offer *offer,char *mimeType)

{
  PFN_wl_proxy_marshal_flags p_Var1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  void *pvVar6;
  ssize_t sVar7;
  int *piVar8;
  char *pcVar9;
  int fds [2];
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  
  iVar3 = pipe2(&local_48,0x80000);
  iVar2 = local_44;
  p_Var1 = _glfw.wl.client.proxy_marshal_flags;
  if (iVar3 == -1) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    _glfwInputError(0x10008,"Wayland: Failed to create pipe for data offer: %s",pcVar9);
    return (char *)0x0;
  }
  uVar4 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)offer);
  (*p_Var1)((wl_proxy *)offer,1,(wl_interface *)0x0,uVar4,0,mimeType,iVar2);
  flushDisplay();
  close(local_44);
  local_38 = 1;
  local_40 = 0;
  pvVar6 = _glfw_realloc((void *)0x0,0x1001);
  if (pvVar6 == (void *)0x0) {
    _glfwInputError(0x10005,(char *)0x0);
    close(local_48);
    uVar5 = 1;
  }
  else {
    sVar7 = read(local_48,(void *)((long)pvVar6 + local_40),0x1000);
    if (sVar7 == 0) {
      uVar5 = 2;
    }
    else if (sVar7 == -1) {
      piVar8 = __errno_location();
      uVar5 = 3;
      if (*piVar8 != 4) {
        pcVar9 = strerror(*piVar8);
        _glfwInputError(0x10008,"Wayland: Failed to read from data offer pipe: %s",pcVar9);
        close(local_48);
        pcVar9 = (char *)(*(code *)((long)&DAT_0014de78 + (long)(int)(&DAT_0014de78)[local_38]))();
        return pcVar9;
      }
    }
    else {
      uVar5 = 0;
    }
  }
  pcVar9 = (char *)(*(code *)((long)&DAT_0014de78 + (long)(int)(&DAT_0014de78)[uVar5]))();
  return pcVar9;
}

Assistant:

static char* readDataOfferAsString(struct wl_data_offer* offer, const char* mimeType)
{
    int fds[2];

    if (pipe2(fds, O_CLOEXEC) == -1)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create pipe for data offer: %s",
                        strerror(errno));
        return NULL;
    }

    wl_data_offer_receive(offer, mimeType, fds[1]);
    flushDisplay();
    close(fds[1]);

    char* string = NULL;
    size_t size = 0;
    size_t length = 0;

    for (;;)
    {
        const size_t readSize = 4096;
        const size_t requiredSize = length + readSize + 1;
        if (requiredSize > size)
        {
            char* longer = _glfw_realloc(string, requiredSize);
            if (!longer)
            {
                _glfwInputError(GLFW_OUT_OF_MEMORY, NULL);
                close(fds[0]);
                return NULL;
            }

            string = longer;
            size = requiredSize;
        }

        const ssize_t result = read(fds[0], string + length, readSize);
        if (result == 0)
            break;
        else if (result == -1)
        {
            if (errno == EINTR)
                continue;

            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Wayland: Failed to read from data offer pipe: %s",
                            strerror(errno));
            close(fds[0]);
            return NULL;
        }

        length += result;
    }

    close(fds[0]);

    string[length] = '\0';
    return string;
}